

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O0

int __thiscall Bstrlib::CBString::reversefind(CBString *this,char *b,int pos)

{
  int iVar1;
  CBStringException *this_00;
  size_t sVar2;
  undefined4 local_ac;
  allocator local_79;
  string local_78;
  undefined1 local_58 [8];
  CBStringException bstr__cppwrapper_exception;
  tagbstring t;
  int pos_local;
  char *b_local;
  CBString *this_local;
  
  if (b == (char *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)&local_78,"CBString::CBString::reversefind NULL.",&local_79);
    CBStringException::CBStringException((CBStringException *)local_58,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator((allocator<char> *)&local_79);
    this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(this_00,(CBStringException *)local_58);
    __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  if (b == (char *)0x0) {
    local_ac = 0;
  }
  else {
    sVar2 = strlen(b);
    local_ac = (undefined4)sVar2;
  }
  bstr__cppwrapper_exception.msg.field_2._12_4_ = local_ac;
  bstr__cppwrapper_exception.msg.field_2._8_4_ = 0xffffffff;
  iVar1 = binstrr(&this->super_tagbstring,pos,
                  (const_bstring)((long)&bstr__cppwrapper_exception.msg.field_2 + 8));
  return iVar1;
}

Assistant:

int CBString::reversefind (const char * b, int pos) const {
struct tagbstring t;
	if (NULL == b) {
#ifdef BSTRLIB_THROWS_EXCEPTIONS
		bstringThrow ("CBString::reversefind NULL.");
#else
		return BSTR_ERR;
#endif
	}
	cstr2tbstr (t, b);
	return binstrr ((bstring) this, pos, &t);
}